

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O1

int * Hsh_IntManLookup(Hsh_IntMan_t *p,uint *pData)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint *puVar8;
  word *pwVar9;
  
  iVar1 = p->nSize;
  uVar3 = p->vTable->nSize;
  if ((long)iVar1 < 1) {
    uVar6 = 0;
  }
  else {
    uVar7 = 1;
    if (1 < iVar1 * 4) {
      uVar7 = (ulong)(uint)(iVar1 * 4);
    }
    uVar5 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 + (uint)*(byte *)((long)pData + uVar5) * (&Hsh_IntManHash_s_Primes)[uVar5 % 7];
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
  }
  uVar7 = (ulong)uVar6 % (ulong)uVar3;
  iVar4 = (int)uVar7;
  if ((-1 < iVar4) && (iVar4 < (int)uVar3)) {
    puVar2 = (uint *)(p->vTable->pArray + uVar7);
    while( true ) {
      puVar8 = puVar2;
      uVar3 = *puVar8;
      if ((ulong)uVar3 == 0xffffffff) {
        pwVar9 = (word *)0x0;
      }
      else {
        if (((int)uVar3 < 0) || (p->vObjs->nSize <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pwVar9 = p->vObjs->pArray + uVar3;
      }
      if (pwVar9 == (word *)0x0) {
        if (uVar3 == 0xffffffff) {
          return (int *)puVar8;
        }
        __assert_fail("*pPlace == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecHsh.h"
                      ,0x9c,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
      }
      uVar3 = (int)*pwVar9 * iVar1;
      if (((int)uVar3 < 0) || (p->vData->nSize <= (int)uVar3)) break;
      iVar4 = bcmp(pData,p->vData->pArray + uVar3,(long)iVar1 * 4);
      puVar2 = (uint *)((long)pwVar9 + 4);
      if (iVar4 == 0) {
        return (int *)puVar8;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

static inline int * Hsh_IntManLookup( Hsh_IntMan_t * p, unsigned * pData )
{
    Hsh_IntObj_t * pObj;
    int * pPlace = Vec_IntEntryP( p->vTable, Hsh_IntManHash(pData, p->nSize, Vec_IntSize(p->vTable)) );
    for ( ; (pObj = Hsh_IntObj(p, *pPlace)); pPlace = &pObj->iNext )
        if ( !memcmp( pData, Hsh_IntData(p, pObj->iData), sizeof(int) * p->nSize ) )
            return pPlace;
    assert( *pPlace == -1 );
    return pPlace;
}